

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_bool
utf8proc_grapheme_break_stateful(utf8proc_int32_t c1,utf8proc_int32_t c2,utf8proc_int32_t *state)

{
  byte bVar1;
  utf8proc_bool uVar2;
  utf8proc_property_t *puVar3;
  
  puVar3 = utf8proc_get_property(c1);
  bVar1 = puVar3->field_0x15;
  puVar3 = utf8proc_get_property(c2);
  uVar2 = grapheme_break_extended((uint)bVar1,(uint)(byte)puVar3->field_0x15,state);
  return uVar2;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_bool utf8proc_grapheme_break_stateful(
    utf8proc_int32_t c1, utf8proc_int32_t c2, utf8proc_int32_t *state) {

  return grapheme_break_extended(utf8proc_get_property(c1)->boundclass,
                                 utf8proc_get_property(c2)->boundclass,
                                 state);
}